

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * createAggContext(sqlite3_context *p,int nByte)

{
  Mem *p_00;
  char *__s;
  
  p_00 = p->pMem;
  if (nByte < 1) {
    if ((p_00->flags & 0x2400) == 0) {
      p_00->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(p_00);
    }
    p_00->z = (char *)0x0;
  }
  else {
    if (p_00->szMalloc < nByte) {
      sqlite3VdbeMemGrow(p_00,nByte,0);
      __s = p_00->z;
    }
    else {
      __s = p_00->zMalloc;
      p_00->z = __s;
    }
    p_00->flags = 0x2000;
    p_00->u = (MemValue)p->pFunc;
    if (__s != (char *)0x0) {
      memset(__s,0,(ulong)(uint)nByte);
      return p_00->z;
    }
  }
  return (void *)0x0;
}

Assistant:

static SQLITE_NOINLINE void *createAggContext(sqlite3_context *p, int nByte){
  Mem *pMem = p->pMem;
  assert( (pMem->flags & MEM_Agg)==0 );
  if( nByte<=0 ){
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = 0;
  }else{
    sqlite3VdbeMemClearAndResize(pMem, nByte);
    pMem->flags = MEM_Agg;
    pMem->u.pDef = p->pFunc;
    if( pMem->z ){
      memset(pMem->z, 0, nByte);
    }
  }
  return (void*)pMem->z;
}